

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86MOV(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x350,"int x86MOV(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
  }
  bVar1 = 8 < (int)base | (8 < (int)index) * '\x02' | (8 < (int)dst) << 2 | (size == sQWORD) << 3;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
  }
  puVar4 = stream + (bVar1 != 0);
  if ((dst == rEAX) && ((base == rNONE && index == rNONE) && (char)shift != shift)) {
    *puVar4 = 0xa1;
    *(int *)(puVar4 + 1) = shift;
    iVar3 = (int)puVar4 + 5;
  }
  else {
    *puVar4 = 0x8b;
    uVar2 = encodeAddress(puVar4 + 1,index,multiplier,base,shift,(int)regCode[dst]);
    iVar3 = (int)puVar4 + uVar2 + 1;
  }
  return iVar3 - (int)stream;
}

Assistant:

int x86MOV(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, dst, index, base);

	if(dst == rEAX && (char)(shift) != shift && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa1;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x8b;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}